

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O2

void __thiscall
xray_re::xr_mesh_vbuf::push(xr_mesh_vbuf *this,xr_vbuf *vb,xr_ibuf *ib,fmatrix *xform)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  fvector2 fVar3;
  size_t sVar4;
  fvector3 *pfVar5;
  ulong uVar6;
  uint16_t *puVar7;
  fvector3 *pfVar8;
  fvector2 *pfVar9;
  size_t sVar10;
  finfluence *pfVar11;
  finfluence *pfVar12;
  fvector2 fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  long lVar22;
  xr_mesh_vbuf *this_00;
  ulong uVar23;
  char *__assertion;
  ulong reserved;
  fvector3 normal;
  
  this_00 = this;
  if ((this->super_xr_vbuf).m_signature == 0) {
    if ((this->super_xr_vbuf).super_xr_flexbuf.m_size != 0) {
      __assertion = "size() == 0";
      uVar17 = 0x43;
      goto LAB_00168909;
    }
    set_signature(this,vb->m_signature);
  }
  reserved = (vb->super_xr_flexbuf).m_size + (this->super_xr_vbuf).super_xr_flexbuf.m_size;
  if (this->m_reserved < reserved) {
    this_00 = this;
    reserve(this,reserved);
  }
  if (((this->super_xr_vbuf).m_signature & 1) != 0) {
    if ((vb->m_signature & 1) == 0) {
      __assertion = "vb.has_points()";
      uVar17 = 0x4a;
      goto LAB_00168909;
    }
    if (xform == (fmatrix *)0x0) {
      sVar4 = (vb->super_xr_flexbuf).m_size;
      if (sVar4 != 0) {
        memmove((this->super_xr_vbuf).m_points + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
                vb->m_points,sVar4 * 0xc);
      }
    }
    else {
      transform_points(this_00,vb->m_points,
                       (this->super_xr_vbuf).m_points +
                       (this->super_xr_vbuf).super_xr_flexbuf.m_size,(vb->super_xr_flexbuf).m_size,
                       xform);
    }
  }
  if (((this->super_xr_vbuf).m_signature & 2) != 0) {
    if ((vb->m_signature & 2) == 0) {
      if (ib == (xr_ibuf *)0x0) {
        __assertion = "ib";
        uVar17 = 0x59;
        goto LAB_00168909;
      }
      sVar4 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
      pfVar5 = (this->super_xr_vbuf).m_normals;
      uVar6 = (ib->super_xr_flexbuf).m_size;
      for (uVar21 = 0; uVar21 < uVar6; uVar21 = uVar21 + 3) {
        puVar7 = ib->m_indices;
        uVar19 = (ulong)puVar7[uVar21];
        uVar23 = (ulong)puVar7[uVar21 + 1];
        uVar18 = (ulong)puVar7[uVar21 + 2];
        pfVar8 = vb->m_points;
        _vector3<float>::calc_normal(&normal,pfVar8 + uVar19,pfVar8 + uVar23,pfVar8 + uVar18);
        pfVar5[sVar4 + uVar19].field_0.field_0.x = normal.field_0.field_0.x;
        pfVar5[sVar4 + uVar19].field_0.field_0.y = normal.field_0.field_0.y;
        pfVar5[sVar4 + uVar19].field_0.field_0.z = normal.field_0.field_0.z;
        pfVar5[sVar4 + uVar23].field_0.field_0.x = normal.field_0.field_0.x;
        pfVar5[sVar4 + uVar23].field_0.field_0.y = normal.field_0.field_0.y;
        pfVar5[sVar4 + uVar23].field_0.field_0.z = normal.field_0.field_0.z;
        pfVar5[sVar4 + uVar18].field_0.field_0.x = normal.field_0.field_0.x;
        pfVar5[sVar4 + uVar18].field_0.field_0.y = normal.field_0.field_0.y;
        pfVar5[sVar4 + uVar18].field_0.field_0.z = normal.field_0.field_0.z;
      }
    }
    else {
      sVar4 = (vb->super_xr_flexbuf).m_size;
      if (sVar4 != 0) {
        memmove((this->super_xr_vbuf).m_normals + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
                vb->m_normals,sVar4 * 0xc);
      }
    }
  }
  if (((this->super_xr_vbuf).m_signature & 4) != 0) {
    if ((vb->m_signature & 4) == 0) {
      __assertion = "vb.has_texcoords()";
      uVar17 = 0x68;
      goto LAB_00168909;
    }
    sVar4 = (vb->super_xr_flexbuf).m_size;
    if (sVar4 != 0) {
      memmove((this->super_xr_vbuf).m_texcoords + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
              vb->m_texcoords,sVar4 << 3);
    }
    if (this->m_tc_fix == true) {
      sVar4 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
      pfVar9 = (this->super_xr_vbuf).m_texcoords;
      sVar10 = (vb->super_xr_flexbuf).m_size;
      for (sVar20 = 0; sVar10 != sVar20; sVar20 = sVar20 + 1) {
        fVar3.field_0 =
             (anon_union_8_3_f28016de_for__vector2<float>_1)
             *(anon_union_8_3_f28016de_for__vector2<float>_1 *)
              &pfVar9[sVar4 + sVar20].field_0.field_0;
        fVar13.field_0.field_0.y = fVar3.field_0._4_4_ * 0.5;
        fVar13.field_0.field_0.x = fVar3.field_0._0_4_ * 0.5;
        pfVar9[sVar4 + sVar20].field_0 = fVar13.field_0;
      }
    }
  }
  uVar17 = (this->super_xr_vbuf).m_signature;
  if ((uVar17 & 0x10) != 0) {
    if ((vb->m_signature & 0x10) == 0) {
      __assertion = "vb.has_influences()";
      uVar17 = 0x72;
      goto LAB_00168909;
    }
    sVar4 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
    pfVar11 = (this->super_xr_vbuf).m_influences;
    pfVar12 = vb->m_influences;
    sVar10 = (vb->super_xr_flexbuf).m_size;
    for (lVar22 = 0; sVar10 * 0x24 - lVar22 != 0; lVar22 = lVar22 + 0x24) {
      puVar1 = (undefined8 *)
               ((long)&(pfVar12->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                       array[0].bone + lVar22);
      puVar2 = (undefined8 *)
               ((long)&pfVar11[sVar4].super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>
                       .array[0].bone + lVar22);
      *(undefined4 *)(puVar2 + 4) = *(undefined4 *)(puVar1 + 4);
      uVar14 = *puVar1;
      uVar15 = puVar1[1];
      uVar16 = puVar1[3];
      puVar2[2] = puVar1[2];
      puVar2[3] = uVar16;
      *puVar2 = uVar14;
      puVar2[1] = uVar15;
    }
    uVar17 = (this->super_xr_vbuf).m_signature;
  }
  if ((uVar17 & 0x20) != 0) {
    if ((vb->m_signature & 0x20) == 0) {
      __assertion = "vb.has_colors()";
      uVar17 = 0x76;
LAB_00168909:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,uVar17,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    sVar4 = (vb->super_xr_flexbuf).m_size;
    if (sVar4 != 0) {
      memmove((this->super_xr_vbuf).m_colors + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
              vb->m_colors,sVar4 << 4);
    }
  }
  (this->super_xr_vbuf).super_xr_flexbuf.m_size = reserved;
  return;
}

Assistant:

void xr_mesh_vbuf::push(const xr_vbuf& vb, const xr_ibuf* ib, const fmatrix* xform)
{
	if (signature() == 0) {
		xr_assert(size() == 0);
		set_signature(vb.signature());
	}
	size_t new_size = size() + vb.size();
	if (m_reserved < new_size)
		reserve(new_size);
	if (has_points()) {
		xr_assert(vb.has_points());
		if (xform)
			transform_points(vb.p(), m_points + size(), vb.size(), *xform);
		else
			copy(vb.p(), m_points + size(), vb.size());
	}
	if (has_normals()) {
		if (vb.has_normals()) {
			if (false && xform)
				transform_normals(vb.n(), m_normals + size(), vb.size(), *xform);
			else
				copy(vb.n(), m_normals + size(), vb.size());
		} else {
			// generate fake normals for 1xxx builds.
			// FIXME (maybe): this will not work correctly for the duplicate faces.
			xr_assert(ib);
			fvector3* normals = m_normals + size();
			for (size_t i = 0, num_indices = ib->size(); i < num_indices; i += 3) {
				uint32_t v0 = (*ib)[i + 0];
				uint32_t v1 = (*ib)[i + 1];
				uint32_t v2 = (*ib)[i + 2];
				fvector3 normal;
				normal.calc_normal(vb.p(v0), vb.p(v1), vb.p(v2));
				normals[v0].set(normal);
				normals[v1].set(normal);
				normals[v2].set(normal);
			}
		}
	}
	if (has_texcoords()) {
		xr_assert(vb.has_texcoords());
		copy(vb.tc(), m_texcoords + size(), vb.size());
		if (m_tc_fix) {
			fvector2* uv = m_texcoords + size();
			for (size_t n = vb.size(); n != 0; --n, ++uv)
				uv->mul(0.5f);
		}
	}
	// intentionally ignoring lightmaps here
	if (has_influences()) {
		xr_assert(vb.has_influences());
		copy(vb.w(), m_influences + size(), vb.size());
	}
	if (has_colors()) {
		xr_assert(vb.has_colors());
		copy(vb.c(), m_colors + size(), vb.size());
	}
	set_size(new_size);
}